

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::~cmake(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCacheManager *pcVar2;
  cmState *this_00;
  pointer ppcVar3;
  cmVariableWatch *this_01;
  cmFileTimeComparison *this_02;
  pointer pcVar4;
  pointer ppcVar5;
  
  pcVar2 = this->CacheManager;
  if (pcVar2 != (cmCacheManager *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::~_Rb_tree(&(pcVar2->Cache)._M_t);
  }
  operator_delete(pcVar2,0x40);
  operator_delete(this->Policies,1);
  this_00 = this->State;
  if (this_00 != (cmState *)0x0) {
    cmState::~cmState(this_00);
  }
  operator_delete(this_00,0x188);
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  ppcVar3 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar5 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar3;
      ppcVar5 = ppcVar5 + 1) {
    if (*ppcVar5 != (cmGlobalGeneratorFactory *)0x0) {
      (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[1])();
    }
  }
  this_01 = this->VariableWatch;
  if (this_01 != (cmVariableWatch *)0x0) {
    cmVariableWatch::~cmVariableWatch(this_01);
  }
  operator_delete(this_01,0x30);
  this_02 = this->FileComparison;
  if (this_02 != (cmFileTimeComparison *)0x0) {
    cmFileTimeComparison::~cmFileTimeComparison(this_02);
  }
  operator_delete(this_02,8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~_Rb_tree(&(this->InstalledFiles)._M_t);
  pcVar4 = (this->GraphVizFile)._M_dataplus._M_p;
  paVar1 = &(this->GraphVizFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->VSSolutionFile)._M_dataplus._M_p;
  paVar1 = &(this->VSSolutionFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckStampList)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampList).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckStampFile)._M_dataplus._M_p;
  paVar1 = &(this->CheckStampFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CheckBuildSystemArgument)._M_dataplus._M_p;
  paVar1 = &(this->CheckBuildSystemArgument).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CCEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CCEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CXXEnvironment)._M_dataplus._M_p;
  paVar1 = &(this->CXXEnvironment).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->CMakeEditCommand)._M_dataplus._M_p;
  paVar1 = &(this->CMakeEditCommand).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&(this->UsedCliVariables)._M_t);
  pcVar4 = (this->GeneratorToolset)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorToolset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->GeneratorPlatform)._M_dataplus._M_p;
  paVar1 = &(this->GeneratorPlatform).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
  ::~_Rb_tree(&(this->ExtraGenerators)._M_t);
  ppcVar5 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar5 != (pointer)0x0) {
    operator_delete(ppcVar5,(long)(this->Generators).
                                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar5
                   );
    return;
  }
  return;
}

Assistant:

cmake::~cmake()
{
  delete this->CacheManager;
  delete this->Policies;
  delete this->State;
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    this->GlobalGenerator = 0;
    }
  cmDeleteAll(this->Generators);
#ifdef CMAKE_BUILD_WITH_CMAKE
  delete this->VariableWatch;
#endif
  delete this->FileComparison;
}